

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_array.h
# Opt level: O1

void __thiscall
gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::set_capacity
          (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this,
          size_type_conflict n)

{
  uint uVar1;
  size_type_conflict sVar2;
  S2LogMessage local_20;
  
  if (n < (*(uint *)this & 0xffffff)) {
    S2LogMessage::S2LogMessage
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/compact_array.h"
               ,0x16c,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_20.stream_,"Check failed: (size()) <= (n) ",0x1e);
  }
  else {
    *(uint *)this = *(uint *)this & 0xbfffffff | (uint)(0x3f < n) << 0x1e;
    sVar2 = n;
    if (0x3f < n) {
      sVar2 = Bits::Log2Ceiling(n);
    }
    uVar1 = *(uint *)this;
    *(uint *)this = uVar1 & 0xc0ffffff | (sVar2 & 0x3f) << 0x18;
    if ((n != 0) || ((uVar1 & 0x40000000) == 0 && (sVar2 & 0x3f) == 0)) {
      return;
    }
    S2LogMessage::S2LogMessage
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/compact_array.h"
               ,0x173,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_20.stream_,"Check failed: n == capacity() || n > kInlined ",0x2e);
  }
  abort();
}

Assistant:

void set_capacity(size_type n) {
    S2_DCHECK_LE(size(), n);
    is_exponent_ = (n >= kExponentStart);
    capacity_ = is_exponent_ ? Bits::Log2Ceiling(n) : n;
    // A tiny optimization here would be to set capacity_ to kInlined if
    // it's currently less. We don't bother, because doing so would require
    // changing the existing comments and unittests that say that, for small n,
    // capacity() will be exactly n if one calls reserve(n).
    S2_DCHECK(n == capacity() || n > kInlined);
  }